

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_trie.c
# Opt level: O3

trie_node trie_node_get(trie t,vector keys)

{
  trie_node ptVar1;
  size_t sVar2;
  undefined8 *puVar3;
  set_value pvVar4;
  trie_node ptVar5;
  ulong uVar6;
  bool bVar7;
  
  sVar2 = vector_size(keys);
  ptVar5 = t->root;
  if (sVar2 != 0 && ptVar5 != (trie_node)0x0) {
    uVar6 = 1;
    while( true ) {
      puVar3 = (undefined8 *)vector_at(keys,uVar6 - 1);
      if ((ptVar5->childs == (set)0x0) ||
         (pvVar4 = set_get(ptVar5->childs,(set_key)*puVar3), pvVar4 == (set_value)0x0)) break;
      ptVar1 = t->node_list;
      ptVar5 = ptVar1 + *(long *)((long)pvVar4 + 8);
      if (ptVar1 != (trie_node)0x0 && sVar2 == uVar6) {
        return ptVar5;
      }
      if (ptVar1 == (trie_node)0x0) {
        return (trie_node)0x0;
      }
      bVar7 = sVar2 <= uVar6;
      uVar6 = uVar6 + 1;
      if (bVar7) {
        return (trie_node)0x0;
      }
    }
  }
  return (trie_node)0x0;
}

Assistant:

trie_node trie_node_get(trie t, vector keys)
{
	if (t != NULL)
	{
		size_t iterator, size = vector_size(keys);

		trie_node current_node = t->root;

		for (iterator = 0; current_node != NULL && iterator < size; ++iterator)
		{
			trie_key *key_ptr = vector_at(keys, iterator);

			trie_node next_node = NULL;

			if (current_node->childs != NULL)
			{
				trie_node_ref node_ref = set_get(current_node->childs, *key_ptr);

				if (node_ref != NULL)
				{
					next_node = &t->node_list[node_ref->index];
				}
			}

			if (iterator == (size - 1) && next_node != NULL)
			{
				return next_node;
			}

			current_node = next_node;
		}
	}

	return NULL;
}